

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::IntegrationTest_shouldSendBodyAsUtf8_Test::
~IntegrationTest_shouldSendBodyAsUtf8_Test(IntegrationTest_shouldSendBodyAsUtf8_Test *this)

{
  IntegrationTest_shouldSendBodyAsUtf8_Test *this_local;
  
  ~IntegrationTest_shouldSendBodyAsUtf8_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntegrationTest, shouldSendBodyAsUtf8) {
  const std::string counter_name = "example_total";
  auto registry = RegisterSomeCounter(counter_name, default_metrics_path_);

  const auto metrics = FetchMetrics(default_metrics_path_);

  // check content type

  ASSERT_EQ(metrics.code, 200);
  EXPECT_THAT(metrics.contentType, HasSubstr("utf-8"));
}